

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lateral_binder.cpp
# Opt level: O1

void __thiscall
duckdb::ExpressionDepthReducerRecursive::VisitBoundTableRef
          (ExpressionDepthReducerRecursive *this,BoundTableRef *ref)

{
  BoundJoinRef *pBVar1;
  
  if (ref->type == JOIN) {
    pBVar1 = BoundTableRef::Cast<duckdb::BoundJoinRef>(ref);
    ReduceColumnDepth(&pBVar1->correlated_columns,this->correlated_columns);
  }
  BoundNodeVisitor::VisitBoundTableRef(&this->super_BoundNodeVisitor,ref);
  return;
}

Assistant:

void VisitBoundTableRef(BoundTableRef &ref) override {
		if (ref.type == TableReferenceType::JOIN) {
			// rewrite correlated columns in child joins
			auto &bound_join = ref.Cast<BoundJoinRef>();
			ReduceColumnDepth(bound_join.correlated_columns, correlated_columns);
		}
		// visit the children of the table ref
		BoundNodeVisitor::VisitBoundTableRef(ref);
	}